

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  size_t __size;
  uchar uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int *__s;
  int *piVar16;
  uchar *puVar17;
  uint *puVar18;
  uint *puVar19;
  uint *frequencies;
  unsigned_short uVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  LodePNGCompressSettings *pLVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong insize_00;
  ulong inpos;
  long lVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar64;
  int iVar69;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  ucvector v;
  undefined1 local_248 [16];
  size_t local_238;
  uint local_224;
  uint *local_220;
  uchar *local_218;
  size_t local_210;
  uint *local_208;
  uint *local_200;
  LodePNGCompressSettings *local_1f8;
  uchar **local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  int *local_1d0;
  ulong local_1c8;
  uchar *local_1c0;
  LodePNGBitWriter local_1b8;
  undefined1 local_1a8 [16];
  size_t local_198;
  undefined1 local_188 [16];
  unsigned_short *local_178;
  ulong local_170;
  HuffmanTree tree_cl;
  HuffmanTree tree_ll;
  undefined1 local_108 [16];
  size_t local_f8;
  unsigned_short *local_e8;
  ulong local_e0;
  int *local_d8;
  unsigned_short *local_d0;
  undefined1 local_c8 [16];
  size_t local_b8;
  HuffmanTree tree_d;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_1b8.data = &v;
  local_1b8.bp = 0;
  uVar30 = settings->btype;
  uVar13 = 0x3d;
  if (uVar30 < 3) {
    local_1c8 = insize;
    v.allocsize = v.size;
    local_210 = insize;
    local_1f0 = out;
    local_1c0 = in;
    if (uVar30 != 1) {
      if (uVar30 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar13 = 0;
        }
        else {
          local_1e0 = (insize + 0xfffe) / 0xffff;
          local_1e8 = local_1e0 - 1;
          uVar32 = 0;
          uVar30 = 0;
          do {
            sVar27 = v.size;
            uVar23 = v.size + 1;
            puVar17 = v.data;
            uVar21 = v.allocsize;
            if (v.allocsize < uVar23) {
              uVar21 = uVar23 * 3 >> 1;
              if (v.allocsize * 2 < uVar23) {
                uVar21 = uVar23;
              }
              puVar17 = (uchar *)realloc(v.data,uVar21);
              if (puVar17 != (uchar *)0x0) goto LAB_0010f232;
            }
            else {
LAB_0010f232:
              v.allocsize = uVar21;
              v.data = puVar17;
              v.data[sVar27] = uVar32 == local_1e8;
              v.size = uVar23;
            }
            sVar27 = v.size;
            local_188._0_8_ = uVar32;
            uVar32 = (ulong)uVar30;
            iVar64 = (int)insize - uVar30;
            if (0xfffe < insize - uVar32) {
              iVar64 = 0xffff;
            }
            uVar23 = v.size + 1;
            puVar17 = v.data;
            uVar21 = v.allocsize;
            if (v.allocsize < uVar23) {
              uVar21 = uVar23 * 3 >> 1;
              if (v.allocsize * 2 < uVar23) {
                uVar21 = uVar23;
              }
              puVar17 = (uchar *)realloc(v.data,uVar21);
              if (puVar17 != (uchar *)0x0) goto LAB_0010f2aa;
            }
            else {
LAB_0010f2aa:
              v.allocsize = uVar21;
              v.data = puVar17;
              v.data[sVar27] = (uchar)iVar64;
              v.size = uVar23;
            }
            sVar27 = v.size;
            uVar23 = v.size + 1;
            puVar17 = v.data;
            uVar21 = v.allocsize;
            if (v.allocsize < uVar23) {
              uVar21 = uVar23 * 3 >> 1;
              if (v.allocsize * 2 < uVar23) {
                uVar21 = uVar23;
              }
              puVar17 = (uchar *)realloc(v.data,uVar21);
              if (puVar17 != (uchar *)0x0) goto LAB_0010f2fd;
            }
            else {
LAB_0010f2fd:
              v.allocsize = uVar21;
              v.data = puVar17;
              v.data[sVar27] = (uchar)((uint)iVar64 >> 8);
              v.size = uVar23;
            }
            sVar27 = v.size;
            uVar23 = v.size + 1;
            puVar17 = v.data;
            uVar21 = v.allocsize;
            if (v.allocsize < uVar23) {
              uVar21 = uVar23 * 3 >> 1;
              if (v.allocsize * 2 < uVar23) {
                uVar21 = uVar23;
              }
              puVar17 = (uchar *)realloc(v.data,uVar21);
              if (puVar17 != (uchar *)0x0) goto LAB_0010f35f;
            }
            else {
LAB_0010f35f:
              v.allocsize = uVar21;
              v.data = puVar17;
              v.data[sVar27] = (uchar)(0xffff - iVar64);
              v.size = uVar23;
            }
            insize = local_210;
            sVar27 = v.size;
            uVar23 = v.size + 1;
            puVar17 = v.data;
            uVar21 = v.allocsize;
            if (v.allocsize < uVar23) {
              uVar21 = uVar23 * 3 >> 1;
              if (v.allocsize * 2 < uVar23) {
                uVar21 = uVar23;
              }
              puVar17 = (uchar *)realloc(v.data,uVar21);
              if (puVar17 != (uchar *)0x0) goto LAB_0010f3b0;
            }
            else {
LAB_0010f3b0:
              v.allocsize = uVar21;
              v.data = puVar17;
              v.data[sVar27] = (uchar)((uint)(0xffff - iVar64) >> 8);
              v.size = uVar23;
            }
            if (uVar32 < insize) {
              uVar21 = 0;
              do {
                sVar27 = v.size;
                uVar2 = local_1c0[uVar32];
                uVar23 = v.size + 1;
                puVar17 = v.data;
                uVar32 = v.allocsize;
                if (v.allocsize < uVar23) {
                  uVar32 = uVar23 * 3 >> 1;
                  if (v.allocsize * 2 < uVar23) {
                    uVar32 = uVar23;
                  }
                  puVar17 = (uchar *)realloc(v.data,uVar32);
                  if (puVar17 != (uchar *)0x0) goto LAB_0010f415;
                }
                else {
LAB_0010f415:
                  v.allocsize = uVar32;
                  v.data = puVar17;
                  v.data[sVar27] = uVar2;
                  v.size = uVar23;
                }
                uVar23 = uVar21 + 1;
              } while ((uVar21 < 0xfffe) &&
                      (uVar32 = (ulong)((int)uVar21 + uVar30 + 1), uVar21 = uVar23, uVar32 < insize)
                      );
              uVar30 = uVar30 + (int)uVar23;
            }
            uVar32 = local_188._0_8_ + 1;
          } while (uVar32 != local_1e0);
          uVar13 = 0;
          out = local_1f0;
        }
        goto LAB_0011013e;
      }
      uVar32 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar32 = insize >> 3;
      }
      if (0x3fff7 < uVar32) {
        uVar32 = 0x3fff8;
      }
      local_1c8 = uVar32 + 8;
    }
    local_170 = 1;
    if (!CARRY8(insize - 1,local_1c8)) {
      local_170 = ((insize - 1) + local_1c8) / local_1c8;
    }
    uVar32 = (ulong)settings->windowsize;
    local_1f8 = settings;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    piVar16 = (int *)malloc(uVar32 * 4);
    __size = uVar32 * 2;
    hash.val = piVar16;
    local_178 = (unsigned_short *)malloc(__size);
    hash.chain = local_178;
    local_d0 = (unsigned_short *)malloc(__size);
    hash.zeros = local_d0;
    local_1d0 = (int *)malloc(0x40c);
    hash.headz = local_1d0;
    local_e8 = (unsigned_short *)malloc(__size);
    pLVar26 = local_1f8;
    uVar13 = 0x53;
    uVar30 = 0x53;
    out = local_1f0;
    if (((((piVar16 != (int *)0x0) && (uVar13 = uVar30, __s != (int *)0x0)) &&
         (local_178 != (unsigned_short *)0x0)) &&
        ((local_d0 != (unsigned_short *)0x0 && (local_1d0 != (int *)0x0)))) &&
       (local_e8 != (unsigned_short *)0x0)) {
      local_d8 = piVar16;
      hash.chainz = local_e8;
      memset(__s,0xff,0x40000);
      if (uVar32 == 0) {
        memset(local_1d0,0xff,0x40c);
        sVar27 = local_210;
      }
      else {
        memset(local_d8,0xff,uVar32 * 4);
        sVar27 = local_210;
        auVar10 = _DAT_001293b0;
        lVar25 = uVar32 - 1;
        auVar37._8_4_ = (int)lVar25;
        auVar37._0_8_ = lVar25;
        auVar37._12_4_ = (int)((ulong)lVar25 >> 0x20);
        uVar21 = 0;
        local_188 = auVar37 ^ _DAT_001293b0;
        auVar46 = _DAT_00129370;
        auVar72 = _DAT_00129380;
        auVar76 = _DAT_00129390;
        auVar50 = _DAT_001293a0;
        do {
          auVar37 = auVar50 ^ auVar10;
          iVar77 = local_188._0_4_;
          iVar64 = -(uint)(iVar77 < auVar37._0_4_);
          iVar78 = local_188._4_4_;
          auVar38._4_4_ = -(uint)(iVar78 < auVar37._4_4_);
          iVar79 = local_188._8_4_;
          iVar69 = -(uint)(iVar79 < auVar37._8_4_);
          iVar80 = local_188._12_4_;
          auVar38._12_4_ = -(uint)(iVar80 < auVar37._12_4_);
          auVar56._4_4_ = iVar64;
          auVar56._0_4_ = iVar64;
          auVar56._8_4_ = iVar69;
          auVar56._12_4_ = iVar69;
          auVar70 = pshuflw(in_XMM8,auVar56,0xe8);
          auVar40._4_4_ = -(uint)(auVar37._4_4_ == iVar78);
          auVar40._12_4_ = -(uint)(auVar37._12_4_ == iVar80);
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar75 = pshuflw(in_XMM9,auVar40,0xe8);
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar37 = pshuflw(auVar70,auVar38,0xe8);
          auVar71._8_4_ = 0xffffffff;
          auVar71._0_8_ = 0xffffffffffffffff;
          auVar71._12_4_ = 0xffffffff;
          auVar71 = (auVar37 | auVar75 & auVar70) ^ auVar71;
          auVar37 = packssdw(auVar71,auVar71);
          uVar20 = (unsigned_short)uVar21;
          if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_178[uVar21] = uVar20;
          }
          auVar38 = auVar40 & auVar56 | auVar38;
          auVar37 = packssdw(auVar38,auVar38);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar37 = packssdw(auVar37 ^ auVar3,auVar37 ^ auVar3);
          if ((auVar37._0_4_ >> 0x10 & 1) != 0) {
            local_178[uVar21 + 1] = uVar20 + 1;
          }
          auVar37 = auVar76 ^ auVar10;
          iVar64 = -(uint)(iVar77 < auVar37._0_4_);
          auVar65._4_4_ = -(uint)(iVar78 < auVar37._4_4_);
          iVar69 = -(uint)(iVar79 < auVar37._8_4_);
          auVar65._12_4_ = -(uint)(iVar80 < auVar37._12_4_);
          auVar39._4_4_ = iVar64;
          auVar39._0_4_ = iVar64;
          auVar39._8_4_ = iVar69;
          auVar39._12_4_ = iVar69;
          auVar57._4_4_ = -(uint)(auVar37._4_4_ == iVar78);
          auVar57._12_4_ = -(uint)(auVar37._12_4_ == iVar80);
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar37 = auVar57 & auVar39 | auVar65;
          auVar37 = packssdw(auVar37,auVar37);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
          if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_178[uVar21 + 2] = uVar20 + 2;
          }
          auVar71 = pshufhw(auVar39,auVar39,0x84);
          auVar38 = pshufhw(auVar57,auVar57,0x84);
          auVar40 = pshufhw(auVar71,auVar65,0x84);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar41 = (auVar40 | auVar38 & auVar71) ^ auVar41;
          auVar71 = packssdw(auVar41,auVar41);
          if ((auVar71 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_178[uVar21 + 3] = uVar20 + 3;
          }
          auVar71 = auVar72 ^ auVar10;
          iVar64 = -(uint)(iVar77 < auVar71._0_4_);
          auVar43._4_4_ = -(uint)(iVar78 < auVar71._4_4_);
          iVar69 = -(uint)(iVar79 < auVar71._8_4_);
          auVar43._12_4_ = -(uint)(iVar80 < auVar71._12_4_);
          auVar58._4_4_ = iVar64;
          auVar58._0_4_ = iVar64;
          auVar58._8_4_ = iVar69;
          auVar58._12_4_ = iVar69;
          auVar37 = pshuflw(auVar37,auVar58,0xe8);
          auVar42._4_4_ = -(uint)(auVar71._4_4_ == iVar78);
          auVar42._12_4_ = -(uint)(auVar71._12_4_ == iVar80);
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          in_XMM9 = pshuflw(auVar75 & auVar70,auVar42,0xe8);
          in_XMM9 = in_XMM9 & auVar37;
          auVar43._0_4_ = auVar43._4_4_;
          auVar43._8_4_ = auVar43._12_4_;
          auVar37 = pshuflw(auVar37,auVar43,0xe8);
          auVar70._8_4_ = 0xffffffff;
          auVar70._0_8_ = 0xffffffffffffffff;
          auVar70._12_4_ = 0xffffffff;
          auVar70 = (auVar37 | in_XMM9) ^ auVar70;
          auVar37 = packssdw(auVar70,auVar70);
          if ((auVar37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_178[uVar21 + 4] = uVar20 + 4;
          }
          auVar43 = auVar42 & auVar58 | auVar43;
          auVar37 = packssdw(auVar43,auVar43);
          auVar75._8_4_ = 0xffffffff;
          auVar75._0_8_ = 0xffffffffffffffff;
          auVar75._12_4_ = 0xffffffff;
          auVar37 = packssdw(auVar37 ^ auVar75,auVar37 ^ auVar75);
          if ((auVar37 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_178[uVar21 + 5] = uVar20 + 5;
          }
          auVar37 = auVar46 ^ auVar10;
          iVar64 = -(uint)(iVar77 < auVar37._0_4_);
          auVar66._4_4_ = -(uint)(iVar78 < auVar37._4_4_);
          iVar69 = -(uint)(iVar79 < auVar37._8_4_);
          auVar66._12_4_ = -(uint)(iVar80 < auVar37._12_4_);
          auVar44._4_4_ = iVar64;
          auVar44._0_4_ = iVar64;
          auVar44._8_4_ = iVar69;
          auVar44._12_4_ = iVar69;
          auVar59._4_4_ = -(uint)(auVar37._4_4_ == iVar78);
          auVar59._12_4_ = -(uint)(auVar37._12_4_ == iVar80);
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar66._0_4_ = auVar66._4_4_;
          auVar66._8_4_ = auVar66._12_4_;
          auVar37 = auVar59 & auVar44 | auVar66;
          auVar37 = packssdw(auVar37,auVar37);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar37 ^ auVar5,auVar37 ^ auVar5);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_178[uVar21 + 6] = uVar20 + 6;
          }
          auVar37 = pshufhw(auVar44,auVar44,0x84);
          auVar40 = pshufhw(auVar59,auVar59,0x84);
          auVar71 = pshufhw(auVar37,auVar66,0x84);
          auVar45._8_4_ = 0xffffffff;
          auVar45._0_8_ = 0xffffffffffffffff;
          auVar45._12_4_ = 0xffffffff;
          auVar45 = (auVar71 | auVar40 & auVar37) ^ auVar45;
          auVar37 = packssdw(auVar45,auVar45);
          if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_178[uVar21 + 7] = uVar20 + 7;
          }
          uVar21 = uVar21 + 8;
          lVar25 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 8;
          auVar50._8_8_ = lVar25 + 8;
          lVar25 = auVar76._8_8_;
          auVar76._0_8_ = auVar76._0_8_ + 8;
          auVar76._8_8_ = lVar25 + 8;
          lVar25 = auVar72._8_8_;
          auVar72._0_8_ = auVar72._0_8_ + 8;
          auVar72._8_8_ = lVar25 + 8;
          lVar25 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 8;
          auVar46._8_8_ = lVar25 + 8;
        } while ((uVar32 + 7 & 0xfffffffffffffff8) != uVar21);
        memset(local_1d0,0xff,0x40c);
        auVar10 = _DAT_001293b0;
        uVar21 = 0;
        auVar33 = _DAT_00129370;
        auVar34 = _DAT_00129380;
        auVar35 = _DAT_00129390;
        auVar36 = _DAT_001293a0;
        do {
          auVar46 = auVar36 ^ auVar10;
          iVar64 = -(uint)((int)local_188._0_4_ < auVar46._0_4_);
          auVar48._4_4_ = -(uint)((int)local_188._4_4_ < auVar46._4_4_);
          iVar69 = -(uint)((int)local_188._8_4_ < auVar46._8_4_);
          auVar48._12_4_ = -(uint)((int)local_188._12_4_ < auVar46._12_4_);
          auVar60._4_4_ = iVar64;
          auVar60._0_4_ = iVar64;
          auVar60._8_4_ = iVar69;
          auVar60._12_4_ = iVar69;
          auVar72 = pshuflw(in_XMM8,auVar60,0xe8);
          auVar47._4_4_ = -(uint)(auVar46._4_4_ == local_188._4_4_);
          auVar47._12_4_ = -(uint)(auVar46._12_4_ == local_188._12_4_);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar76 = pshuflw(in_XMM9,auVar47,0xe8);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar46 = pshuflw(auVar72,auVar48,0xe8);
          auVar73._8_4_ = 0xffffffff;
          auVar73._0_8_ = 0xffffffffffffffff;
          auVar73._12_4_ = 0xffffffff;
          auVar73 = (auVar46 | auVar76 & auVar72) ^ auVar73;
          auVar46 = packssdw(auVar73,auVar73);
          uVar20 = (unsigned_short)uVar21;
          if ((auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_e8[uVar21] = uVar20;
          }
          auVar48 = auVar47 & auVar60 | auVar48;
          auVar46 = packssdw(auVar48,auVar48);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar46 = packssdw(auVar46 ^ auVar6,auVar46 ^ auVar6);
          if ((auVar46._0_4_ >> 0x10 & 1) != 0) {
            local_e8[uVar21 + 1] = uVar20 + 1;
          }
          auVar46 = auVar35 ^ auVar10;
          iVar64 = -(uint)((int)local_188._0_4_ < auVar46._0_4_);
          auVar67._4_4_ = -(uint)((int)local_188._4_4_ < auVar46._4_4_);
          iVar69 = -(uint)((int)local_188._8_4_ < auVar46._8_4_);
          auVar67._12_4_ = -(uint)((int)local_188._12_4_ < auVar46._12_4_);
          auVar49._4_4_ = iVar64;
          auVar49._0_4_ = iVar64;
          auVar49._8_4_ = iVar69;
          auVar49._12_4_ = iVar69;
          auVar61._4_4_ = -(uint)(auVar46._4_4_ == local_188._4_4_);
          auVar61._12_4_ = -(uint)(auVar46._12_4_ == local_188._12_4_);
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar46 = auVar61 & auVar49 | auVar67;
          auVar46 = packssdw(auVar46,auVar46);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar46 = packssdw(auVar46 ^ auVar7,auVar46 ^ auVar7);
          if ((auVar46 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[uVar21 + 2] = uVar20 + 2;
          }
          auVar50 = pshufhw(auVar49,auVar49,0x84);
          auVar71 = pshufhw(auVar61,auVar61,0x84);
          auVar37 = pshufhw(auVar50,auVar67,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar37 | auVar71 & auVar50) ^ auVar51;
          auVar50 = packssdw(auVar51,auVar51);
          if ((auVar50 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_e8[uVar21 + 3] = uVar20 + 3;
          }
          auVar50 = auVar34 ^ auVar10;
          iVar64 = -(uint)((int)local_188._0_4_ < auVar50._0_4_);
          auVar53._4_4_ = -(uint)((int)local_188._4_4_ < auVar50._4_4_);
          iVar69 = -(uint)((int)local_188._8_4_ < auVar50._8_4_);
          auVar53._12_4_ = -(uint)((int)local_188._12_4_ < auVar50._12_4_);
          auVar62._4_4_ = iVar64;
          auVar62._0_4_ = iVar64;
          auVar62._8_4_ = iVar69;
          auVar62._12_4_ = iVar69;
          auVar46 = pshuflw(auVar46,auVar62,0xe8);
          auVar52._4_4_ = -(uint)(auVar50._4_4_ == local_188._4_4_);
          auVar52._12_4_ = -(uint)(auVar50._12_4_ == local_188._12_4_);
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          in_XMM9 = pshuflw(auVar76 & auVar72,auVar52,0xe8);
          in_XMM9 = in_XMM9 & auVar46;
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar46 = pshuflw(auVar46,auVar53,0xe8);
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          auVar74 = (auVar46 | in_XMM9) ^ auVar74;
          auVar46 = packssdw(auVar74,auVar74);
          if ((auVar46 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_e8[uVar21 + 4] = uVar20 + 4;
          }
          auVar53 = auVar52 & auVar62 | auVar53;
          auVar46 = packssdw(auVar53,auVar53);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar46 = packssdw(auVar46 ^ auVar8,auVar46 ^ auVar8);
          if ((auVar46 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_e8[uVar21 + 5] = uVar20 + 5;
          }
          auVar46 = auVar33 ^ auVar10;
          iVar64 = -(uint)((int)local_188._0_4_ < auVar46._0_4_);
          auVar68._4_4_ = -(uint)((int)local_188._4_4_ < auVar46._4_4_);
          iVar69 = -(uint)((int)local_188._8_4_ < auVar46._8_4_);
          auVar68._12_4_ = -(uint)((int)local_188._12_4_ < auVar46._12_4_);
          auVar54._4_4_ = iVar64;
          auVar54._0_4_ = iVar64;
          auVar54._8_4_ = iVar69;
          auVar54._12_4_ = iVar69;
          auVar63._4_4_ = -(uint)(auVar46._4_4_ == local_188._4_4_);
          auVar63._12_4_ = -(uint)(auVar46._12_4_ == local_188._12_4_);
          auVar63._0_4_ = auVar63._4_4_;
          auVar63._8_4_ = auVar63._12_4_;
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar46 = auVar63 & auVar54 | auVar68;
          auVar46 = packssdw(auVar46,auVar46);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar46 ^ auVar9,auVar46 ^ auVar9);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_e8[uVar21 + 6] = uVar20 + 6;
          }
          auVar46 = pshufhw(auVar54,auVar54,0x84);
          auVar76 = pshufhw(auVar63,auVar63,0x84);
          auVar72 = pshufhw(auVar46,auVar68,0x84);
          auVar55._8_4_ = 0xffffffff;
          auVar55._0_8_ = 0xffffffffffffffff;
          auVar55._12_4_ = 0xffffffff;
          auVar55 = (auVar72 | auVar76 & auVar46) ^ auVar55;
          auVar46 = packssdw(auVar55,auVar55);
          if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_e8[uVar21 + 7] = uVar20 + 7;
          }
          uVar21 = uVar21 + 8;
          lVar25 = auVar36._8_8_;
          auVar36._0_8_ = auVar36._0_8_ + 8;
          auVar36._8_8_ = lVar25 + 8;
          lVar25 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 8;
          auVar35._8_8_ = lVar25 + 8;
          lVar25 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 8;
          auVar34._8_8_ = lVar25 + 8;
          lVar25 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 8;
          auVar33._8_8_ = lVar25 + 8;
        } while ((uVar32 + 7 & 0x1fffffff8) != uVar21);
      }
      if (local_170 != 0) {
        uVar32 = local_170 - 1;
        lVar25 = 0;
        uVar29 = 0;
        uVar21 = local_170;
        uVar23 = local_1c8;
        uVar28 = local_1c8;
        puVar17 = local_1c0;
LAB_0010f4be:
        uVar24 = uVar28;
        if (sVar27 < uVar28) {
          uVar24 = sVar27;
        }
        inpos = uVar29 * uVar23;
        insize_00 = inpos + uVar23;
        if (sVar27 <= inpos + uVar23) {
          insize_00 = sVar27;
        }
        uVar30 = (uint)(uVar29 == uVar32);
        if (pLVar26->btype == 2) {
          local_188._0_8_ = lVar25;
          local_108 = (undefined1  [16])0x0;
          local_f8 = 0;
          tree_ll.codes = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_ll.table_len = (uchar *)0x0;
          tree_ll.table_value = (unsigned_short *)0x0;
          tree_d.codes = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_d.table_len = (uchar *)0x0;
          tree_d.table_value = (unsigned_short *)0x0;
          tree_cl.codes = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          tree_cl.table_len = (uchar *)0x0;
          tree_cl.table_value = (unsigned_short *)0x0;
          local_198 = 0;
          local_1a8 = (undefined1  [16])0x0;
          local_248 = (undefined1  [16])0x0;
          local_238 = 0;
          local_c8 = (undefined1  [16])0x0;
          local_b8 = 0;
          local_224 = uVar30;
          if (pLVar26->use_lz77 == 0) {
            local_1e8 = uVar29;
            local_1e0 = uVar28;
            uVar30 = uivector_resize((uivector *)local_108,insize_00 - inpos);
            if (uVar30 == 0) {
              uVar30 = 0x53;
              goto LAB_0010f957;
            }
            if (inpos < insize_00) {
              lVar31 = 0;
              do {
                *(uint *)(local_108._0_8_ + lVar31 * 4) = (uint)puVar17[lVar31];
                lVar31 = lVar31 + 1;
              } while (uVar24 + lVar25 != lVar31);
            }
LAB_0010f7a5:
            puVar18 = (uint *)calloc(1,0x478);
            uVar30 = 0x53;
            if (puVar18 == (uint *)0x0) goto LAB_0010f957;
            puVar19 = (uint *)calloc(1,0x78);
            if (puVar19 == (uint *)0x0) {
              frequencies = (uint *)0x0;
              puVar19 = (uint *)0x0;
              uVar13 = uVar30;
            }
            else {
              if (local_108._8_8_ != 0) {
                sVar22 = 0;
                do {
                  uVar13 = *(uint *)(local_108._0_8_ + sVar22 * 4);
                  puVar18[uVar13] = puVar18[uVar13] + 1;
                  if (0x100 < (ulong)uVar13) {
                    puVar19[*(uint *)(local_108._0_8_ + (sVar22 + 2) * 4)] =
                         puVar19[*(uint *)(local_108._0_8_ + (sVar22 + 2) * 4)] + 1;
                    sVar22 = sVar22 + 3;
                  }
                  sVar22 = sVar22 + 1;
                } while (sVar22 != local_108._8_8_);
              }
              puVar18[0x100] = 1;
              uVar13 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar18,0x101,0x11e,0xf);
              if ((uVar13 == 0) &&
                 (uVar13 = HuffmanTree_makeFromFrequencies(&tree_d,puVar19,2,0x1e,0xf),
                 uVar15 = tree_d.numcodes, uVar13 == 0)) {
                local_e0 = 0x11e;
                if (tree_ll.numcodes < 0x11e) {
                  local_e0 = (ulong)tree_ll.numcodes;
                }
                local_1d8 = 0x1e;
                if (tree_d.numcodes < 0x1e) {
                  local_1d8 = (ulong)tree_d.numcodes;
                }
                local_208 = puVar18;
                if (tree_ll.numcodes != 0) {
                  puVar18 = tree_ll.lengths;
                  uVar21 = 0;
                  do {
                    uVar13 = puVar18[uVar21];
                    uVar14 = uivector_resize((uivector *)local_1a8,local_1a8._8_8_ + 1);
                    if (uVar14 != 0) {
                      *(uint *)(local_1a8._0_8_ + (local_1a8._8_8_ - 1) * 4) = uVar13;
                    }
                    uVar21 = uVar21 + 1;
                  } while (local_e0 != uVar21);
                }
                uVar21 = local_1d8;
                if (uVar15 != 0) {
                  puVar18 = tree_d.lengths;
                  uVar23 = 0;
                  do {
                    uVar13 = puVar18[uVar23];
                    uVar15 = uivector_resize((uivector *)local_1a8,local_1a8._8_8_ + 1);
                    if (uVar15 != 0) {
                      *(uint *)(local_1a8._0_8_ + (local_1a8._8_8_ - 1) * 4) = uVar13;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar21 != uVar23);
                }
                sVar27 = local_210;
                uVar21 = (ulong)(uint)local_1a8._8_4_;
                local_200 = puVar19;
                if (uVar21 != 0) {
                  uVar23 = 0;
                  local_220 = (uint *)local_1a8._0_8_;
                  local_218 = puVar17;
                  do {
                    uVar28 = uVar23 + 1;
                    uVar13 = local_220[uVar23];
                    if (uVar28 < uVar21) {
                      uVar24 = 0;
                      uVar29 = uVar28;
                      do {
                        if (local_220[uVar29] != uVar13) break;
                        uVar24 = (ulong)((int)uVar24 + 1);
                        uVar29 = uVar28 + uVar24;
                      } while (uVar29 < uVar21);
                      uVar15 = (uint)uVar24;
                      if (uVar15 < 2 || uVar13 != 0) {
                        puVar19 = local_200;
                        if (uVar15 < 3) goto LAB_0010fbf8;
                        uVar14 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = uVar13;
                        }
                        uVar28 = uVar24 / 6;
                        if (5 < uVar15) {
                          do {
                            uVar13 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                            if (uVar13 != 0) {
                              *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = 0x10;
                            }
                            uVar13 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                            if (uVar13 != 0) {
                              *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = 3;
                            }
                            uVar28 = uVar28 - 1;
                          } while (uVar28 != 0);
                        }
                        uVar13 = uVar15 + (int)(uVar24 / 6) * -6;
                        if (uVar13 < 3) {
                          uVar24 = (ulong)(uVar15 - uVar13);
                          puVar17 = local_218;
                        }
                        else {
                          uVar15 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                          puVar17 = local_218;
                          if (uVar15 != 0) {
                            *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = 0x10;
                          }
                          uVar15 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                          if (uVar15 != 0) {
                            *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = uVar13 - 3;
                          }
                        }
                      }
                      else {
                        uVar13 = uVar15 + 1;
                        if (uVar13 < 0xb) {
                          uVar13 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                          if (uVar13 != 0) {
                            *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = 0x11;
                          }
                          uVar13 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                          if (uVar13 != 0) {
                            *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = uVar15 - 2;
                          }
                        }
                        else {
                          if (0x89 < uVar13) {
                            uVar13 = 0x8a;
                          }
                          uVar15 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                          if (uVar15 != 0) {
                            *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = 0x12;
                          }
                          uVar15 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                          if (uVar15 != 0) {
                            *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = uVar13 - 0xb;
                          }
                          uVar24 = (ulong)(uVar13 - 1);
                        }
                      }
                      uVar23 = uVar23 + uVar24;
                      puVar19 = local_200;
                    }
                    else {
LAB_0010fbf8:
                      uVar15 = uivector_resize((uivector *)local_248,local_248._8_8_ + 1);
                      if (uVar15 != 0) {
                        *(uint *)(local_248._0_8_ + (local_248._8_8_ - 1) * 4) = uVar13;
                      }
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar23 != uVar21);
                }
                frequencies = (uint *)calloc(1,0x4c);
                if (frequencies == (uint *)0x0) {
                  frequencies = (uint *)0x0;
                  puVar18 = local_208;
                  uVar13 = uVar30;
                }
                else {
                  uVar12 = local_248._8_8_;
                  if (local_248._8_8_ != 0) {
                    sVar22 = 0;
                    do {
                      uVar13 = *(uint *)(local_248._0_8_ + sVar22 * 4);
                      frequencies[uVar13] = frequencies[uVar13] + 1;
                      sVar22 = (sVar22 - ((ulong)uVar13 < 0x10)) + 2;
                    } while (sVar22 != local_248._8_8_);
                  }
                  uVar13 = HuffmanTree_makeFromFrequencies(&tree_cl,frequencies,0x13,0x13,7);
                  puVar18 = local_208;
                  if (uVar13 == 0) {
                    uVar21 = (ulong)tree_cl._16_8_ >> 0x20;
                    uVar15 = uivector_resize((uivector *)local_c8,uVar21);
                    puVar19 = local_200;
                    puVar18 = local_208;
                    uVar13 = uVar30;
                    if (uVar15 != 0) {
                      if (uVar21 != 0) {
                        lVar25 = 0;
                        do {
                          *(uint *)(local_c8._0_8_ + lVar25) =
                               tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar25)];
                          lVar25 = lVar25 + 4;
                        } while (uVar21 << 2 != lVar25);
                      }
                      do {
                        auVar10 = local_c8;
                        uVar11 = local_c8._0_8_;
                        if (((ulong)local_c8._8_8_ < 5) ||
                           (*(uint *)(local_c8._0_8_ + (local_c8._8_8_ - 1) * 4) != 0)) {
                          local_218 = puVar17;
                          writeBits(&local_1b8,local_224,1);
                          writeBits(&local_1b8,0,1);
                          writeBits(&local_1b8,1,1);
                          iVar64 = auVar10._8_4_;
                          uVar23 = (ulong)(iVar64 - 4) + 3;
                          uVar21 = 0;
                          goto LAB_0010ff39;
                        }
                        uVar15 = uivector_resize((uivector *)local_c8,local_c8._8_8_ - 1);
                        puVar19 = local_200;
                        puVar18 = local_208;
                      } while (uVar15 != 0);
                    }
                  }
                }
              }
              else {
                frequencies = (uint *)0x0;
              }
            }
          }
          else {
            local_1e8 = uVar29;
            local_1e0 = uVar28;
            uVar30 = encodeLZ77((uivector *)local_108,&hash,local_1c0,inpos,insize_00,
                                pLVar26->windowsize,pLVar26->minmatch,pLVar26->nicematch,
                                pLVar26->lazymatching);
            if (uVar30 == 0) goto LAB_0010f7a5;
LAB_0010f957:
            frequencies = (uint *)0x0;
            puVar19 = (uint *)0x0;
            puVar18 = (uint *)0x0;
            uVar13 = uVar30;
          }
          goto LAB_0010f968;
        }
        uVar13 = 0;
        if (pLVar26->btype == 1) {
          local_188._0_8_ = lVar25;
          tree_ll.codes = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_ll.table_len = (uchar *)0x0;
          tree_ll.table_value = (unsigned_short *)0x0;
          tree_d.codes = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_d.table_len = (uchar *)0x0;
          tree_d.table_value = (unsigned_short *)0x0;
          local_218 = puVar17;
          local_1e8 = uVar29;
          local_1e0 = uVar28;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          writeBits(&local_1b8,uVar30,1);
          writeBits(&local_1b8,1,1);
          writeBits(&local_1b8,0,1);
          puVar17 = local_218;
          if (pLVar26->use_lz77 == 0) {
            puVar18 = tree_ll.codes;
            puVar19 = tree_ll.lengths;
            if (inpos < insize_00) {
              lVar31 = 0;
              do {
                writeBitsReversed(&local_1b8,puVar18[puVar17[lVar31]],
                                  (ulong)puVar19[puVar17[lVar31]]);
                lVar31 = lVar31 + 1;
              } while (uVar24 + lVar25 != lVar31);
            }
LAB_0010f8d4:
            writeBitsReversed(&local_1b8,puVar18[0x100],(ulong)puVar19[0x100]);
            uVar13 = 0;
            pLVar26 = local_1f8;
          }
          else {
            tree_cl.codes = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            tree_cl.maxbitlen = 0;
            tree_cl.numcodes = 0;
            uVar13 = encodeLZ77((uivector *)&tree_cl,&hash,local_1c0,inpos,insize_00,
                                pLVar26->windowsize,pLVar26->minmatch,pLVar26->nicematch,
                                pLVar26->lazymatching);
            if (uVar13 == 0) {
              writeLZ77data(&local_1b8,(uivector *)&tree_cl,&tree_ll,&tree_d);
              free(tree_cl.codes);
              puVar19 = tree_ll.lengths;
              puVar18 = tree_ll.codes;
              goto LAB_0010f8d4;
            }
            free(tree_cl.codes);
          }
          HuffmanTree_cleanup(&tree_ll);
          HuffmanTree_cleanup(&tree_d);
          uVar21 = local_170;
          uVar23 = local_1c8;
          sVar27 = local_210;
          lVar25 = local_188._0_8_;
          uVar28 = local_1e0;
          uVar29 = local_1e8;
          puVar17 = local_218;
        }
        goto LAB_0010fa0c;
      }
      uVar13 = 0;
LAB_001100e3:
      free(__s);
      free(local_d8);
      free(local_178);
      free(local_d0);
      free(local_1d0);
      free(local_e8);
      out = local_1f0;
    }
  }
LAB_0011013e:
  *out = v.data;
  *outsize = v.size;
  return uVar13;
  while (uVar29 = uVar23 & 0xffffffff, uVar23 = uVar23 - 1, uVar21 = uVar28 + 1,
        *(uint *)(uVar11 + uVar29 * 4) == 0) {
LAB_0010ff39:
    uVar28 = uVar21;
    if (uVar28 == iVar64 - 4) break;
  }
  uVar30 = (uint)(uVar28 + 1);
  local_1d8 = (ulong)((int)local_1d8 - 1);
  local_224 = iVar64 + 1;
  writeBits(&local_1b8,(int)local_e0 - 0x101,5);
  writeBits(&local_1b8,(uint)local_1d8,5);
  writeBits(&local_1b8,(iVar64 - uVar30) - 3,4);
  if (local_224 != uVar30) {
    uVar21 = 0;
    do {
      writeBits(&local_1b8,*(uint *)(uVar11 + uVar21 * 4),3);
      uVar21 = uVar21 + 1;
    } while ((uint)(iVar64 - (int)uVar28) != uVar21);
  }
  sVar27 = local_210;
  if (uVar12 != 0) {
    uVar11 = local_248._0_8_;
    puVar18 = tree_cl.codes;
    puVar19 = tree_cl.lengths;
    sVar22 = 0;
    do {
      writeBitsReversed(&local_1b8,puVar18[*(uint *)(uVar11 + sVar22 * 4)],
                        (ulong)puVar19[*(uint *)(uVar11 + sVar22 * 4)]);
      puVar1 = (uint *)(uVar11 + sVar22 * 4);
      if (*puVar1 - 0x10 < 3) {
        lVar25 = sVar22 + 1;
        sVar22 = sVar22 + 1;
        writeBits(&local_1b8,*(uint *)(uVar11 + lVar25 * 4),
                  *(size_t *)(&DAT_00129e90 + (ulong)(*puVar1 - 0x10) * 8));
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 != uVar12);
  }
  writeLZ77data(&local_1b8,(uivector *)local_108,&tree_ll,&tree_d);
  puVar19 = local_200;
  if ((ulong)tree_ll.lengths[0x100] == 0) {
    puVar17 = local_218;
    puVar18 = local_208;
    uVar13 = 0x40;
  }
  else {
    writeBitsReversed(&local_1b8,tree_ll.codes[0x100],(ulong)tree_ll.lengths[0x100]);
    puVar17 = local_218;
    puVar18 = local_208;
    uVar13 = 0;
  }
LAB_0010f968:
  free((void *)local_108._0_8_);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  free(puVar18);
  free(puVar19);
  free(frequencies);
  free((void *)local_248._0_8_);
  free((void *)local_1a8._0_8_);
  free((void *)local_c8._0_8_);
  uVar21 = local_170;
  uVar23 = local_1c8;
  lVar25 = local_188._0_8_;
  uVar28 = local_1e0;
  uVar29 = local_1e8;
  pLVar26 = local_1f8;
LAB_0010fa0c:
  uVar29 = uVar29 + 1;
  if (uVar29 == uVar21) goto LAB_001100e3;
  uVar28 = uVar28 + uVar23;
  lVar25 = lVar25 - uVar23;
  puVar17 = puVar17 + uVar23;
  if (uVar13 != 0) goto LAB_001100e3;
  goto LAB_0010f4be;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}